

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O0

bool __thiscall nuraft::ngm_singleton::create(ngm_singleton *this)

{
  pointer pnVar1;
  pointer __p;
  unique_ptr<nuraft::nuraft_global_mgr,_std::default_delete<nuraft::nuraft_global_mgr>_> *in_RDI;
  nuraft_global_mgr *in_stack_ffffffffffffffe0;
  
  pnVar1 = std::
           unique_ptr<nuraft::nuraft_global_mgr,_std::default_delete<nuraft::nuraft_global_mgr>_>::
           get(in_RDI);
  if (pnVar1 == (pointer)0x0) {
    __p = (pointer)operator_new(0x178);
    nuraft_global_mgr::nuraft_global_mgr(in_stack_ffffffffffffffe0);
    std::unique_ptr<nuraft::nuraft_global_mgr,std::default_delete<nuraft::nuraft_global_mgr>>::
    unique_ptr<std::default_delete<nuraft::nuraft_global_mgr>,void>(in_RDI,__p);
    std::unique_ptr<nuraft::nuraft_global_mgr,_std::default_delete<nuraft::nuraft_global_mgr>_>::
    operator=(in_RDI,(unique_ptr<nuraft::nuraft_global_mgr,_std::default_delete<nuraft::nuraft_global_mgr>_>
                      *)__p);
    std::unique_ptr<nuraft::nuraft_global_mgr,_std::default_delete<nuraft::nuraft_global_mgr>_>::
    ~unique_ptr((unique_ptr<nuraft::nuraft_global_mgr,_std::default_delete<nuraft::nuraft_global_mgr>_>
                 *)in_stack_ffffffffffffffe0);
  }
  return pnVar1 == (pointer)0x0;
}

Assistant:

bool create() {
        if (internal_.get()) {
            // Already created.
            return false;
        }
        // C++11 doesn't have `make_unique`.
        internal_ =
            std::move( std::unique_ptr<nuraft_global_mgr>( new nuraft_global_mgr() ) );
        return true;
    }